

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_compile_commands.cxx
# Opt level: O0

void __thiscall CompileCommandParser::ExpectOrDie(CompileCommandParser *this,char c,string *message)

{
  bool bVar1;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *message_local;
  CompileCommandParser *pCStack_10;
  char c_local;
  CompileCommandParser *this_local;
  
  local_20 = message;
  message_local._7_1_ = c;
  pCStack_10 = this;
  bVar1 = Expect(this,c);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"\'",&local_c1);
    std::operator+(&local_a0,&local_c0,message_local._7_1_);
    std::operator+(&local_80,&local_a0,"\' expected ");
    std::operator+(&local_60,&local_80,local_20);
    std::operator+(&local_40,&local_60,".");
    ErrorExit(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
  }
  return;
}

Assistant:

void ExpectOrDie(char c, const std::string& message)
  {
    if (!Expect(c)) {
      ErrorExit(std::string("'") + c + "' expected " + message + ".");
    }
  }